

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTestedSize
          (anon_unknown_0 *this,deUint32 target,deUint32 format,IVec3 *targetSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  Vector<int,_3> VVar7;
  IVec3 IVar8;
  bool local_59;
  int height;
  int width;
  Vector<int,_3> local_44;
  int local_38;
  int local_34;
  int size;
  int multiplier;
  bool is3D;
  bool isCube;
  IVec3 texelBlockPixelSize;
  IVec3 *targetSize_local;
  deUint32 format_local;
  deUint32 target_local;
  
  texelBlockPixelSize.m_data._4_8_ = targetSize;
  getTexelBlockPixelSize((anon_unknown_0 *)&multiplier,format);
  size._3_1_ = target == 0x8513;
  local_59 = target == 0x806f || target == 0x8c1a;
  size._2_1_ = local_59;
  if ((bool)size._3_1_) {
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&multiplier);
    iVar2 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&multiplier);
    local_34 = smallestCommonMultiple(iVar1,iVar2);
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)texelBlockPixelSize.m_data._4_8_);
    local_38 = (iVar1 / local_34 + 1) * local_34;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,local_38,local_38,1);
    iVar1 = extraout_EDX;
  }
  else if (target == 0x806f || target == 0x8c1a) {
    tcu::operator/((tcu *)&height,(Vector<int,_3> *)texelBlockPixelSize.m_data._4_8_,
                   (Vector<int,_3> *)&multiplier);
    tcu::operator+((tcu *)&local_44,1,(Vector<int,_3> *)&height);
    VVar7 = tcu::operator*((tcu *)this,&local_44,(Vector<int,_3> *)&multiplier);
    iVar1 = VVar7.m_data[2];
  }
  else {
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)texelBlockPixelSize.m_data._4_8_);
    iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&multiplier);
    iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&multiplier);
    iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)texelBlockPixelSize.m_data._4_8_);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&multiplier);
    iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&multiplier);
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)this,(iVar1 / iVar2 + 1) * iVar3,(iVar4 / iVar5 + -1) * iVar6,1);
    iVar1 = extraout_EDX_00;
  }
  IVar8.m_data[2] = iVar1;
  IVar8.m_data._0_8_ = this;
  return (IVec3)IVar8.m_data;
}

Assistant:

IVec3 getTestedSize (deUint32 target, deUint32 format, const IVec3& targetSize)
{
	const IVec3 texelBlockPixelSize = getTexelBlockPixelSize(format);
	const bool	isCube				= target == GL_TEXTURE_CUBE_MAP;
	const bool	is3D				= target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY;

	if (isCube)
	{
		const int	multiplier	= smallestCommonMultiple(texelBlockPixelSize.x(), texelBlockPixelSize.y());
		const int	size		= (1 + (targetSize.x() / multiplier)) * multiplier;

		return IVec3(size, size, 1);
	}
	else if (is3D)
	{
		return (1 + (targetSize / texelBlockPixelSize)) * texelBlockPixelSize;
	}
	else
	{
		const int width = (1 + targetSize.x() / texelBlockPixelSize.x()) * texelBlockPixelSize.x();
		const int height = ((targetSize.y() / texelBlockPixelSize.y()) - 1) * texelBlockPixelSize.y();

		return IVec3(width, height, 1);
	}
}